

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_esis.c
# Opt level: O1

int parse_esis(int *arr_sz,int *reserved_sz,uint32_t **esi_arr,char *p)

{
  long lVar1;
  long lVar2;
  ushort **ppuVar3;
  ulong uVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  char *endptr;
  char *local_48;
  char *local_40;
  char *local_38;
  
  do {
    lVar1 = strtol(p,&local_48,0);
    pcVar6 = local_48;
    pcVar7 = p;
    if (local_48 != p) {
      local_38 = local_48;
      if (*local_48 == '-') {
        local_40 = p;
        lVar2 = strtol(local_48 + 1,&local_48,0);
        pcVar6 = local_48;
        p = local_40;
        if (lVar1 <= lVar2) {
          do {
            append(arr_sz,reserved_sz,esi_arr,(uint32_t)lVar1);
            lVar1 = lVar1 + 1;
            p = local_40;
          } while (lVar2 + 1 != lVar1);
        }
      }
      else {
        append(arr_sz,reserved_sz,esi_arr,(uint32_t)lVar1);
      }
      cVar5 = *pcVar6;
      if (cVar5 == '\0') {
        uVar4 = 0;
      }
      else {
        ppuVar3 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar3 + (long)cVar5 * 2 + 1) & 0x20) == 0) break;
          cVar5 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        } while (cVar5 != '\0');
        uVar4 = (ulong)(cVar5 == ',');
      }
      pcVar7 = pcVar6 + uVar4;
      pcVar6 = local_38;
    }
    bVar8 = pcVar6 == p;
    p = pcVar7;
    if (bVar8) {
      return 0;
    }
  } while( true );
}

Assistant:

int parse_esis(int* arr_sz,
		int* reserved_sz,
		uint32_t** esi_arr,
		const char* p)
{
	do {
		char* endptr;
		long int v = strtol(p, &endptr, 0);
		if (endptr == p)
			break;
		p = endptr;
		if (*p == '-') {
			/* A range was given, find the end value and
			 * place the entire range in the array.
			 */
			long int ve = strtol(p + 1, &endptr, 0);
			p = endptr;
			while (v <= ve) {
				append(arr_sz, reserved_sz, esi_arr, v);
				++v;
			}
		} else {
			append(arr_sz, reserved_sz, esi_arr, v);
		}
		while (*p != '\0' && isspace(*p))
			++p;
		if (*p == ',')
			++p;
	} while(1);

	return 0;
}